

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

int nn_msgqueue_send(nn_msgqueue *self,nn_msg *msg)

{
  size_t sVar1;
  size_t sVar2;
  nn_msgqueue_chunk *pnVar3;
  bool bVar4;
  size_t msgsz;
  nn_msg *msg_local;
  nn_msgqueue *self_local;
  
  sVar1 = nn_chunkref_size(&msg->sphdr);
  sVar2 = nn_chunkref_size(&msg->body);
  bVar4 = false;
  if (self->count != 0) {
    bVar4 = self->maxmem <= self->mem + sVar1 + sVar2;
  }
  if (bVar4) {
    self_local._4_4_ = -0xb;
  }
  else {
    self->count = self->count + 1;
    self->mem = sVar1 + sVar2 + self->mem;
    nn_msg_mv(((self->out).chunk)->msgs + (self->out).pos,msg);
    (self->out).pos = (self->out).pos + 1;
    if ((self->out).pos == 0x7e) {
      if (self->cache == (nn_msgqueue_chunk *)0x0) {
        pnVar3 = (nn_msgqueue_chunk *)nn_alloc_(0x2f48);
        self->cache = pnVar3;
        if (self->cache == (nn_msgqueue_chunk *)0x0) {
          fprintf(_stderr,"Out of memory (%s:%d)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/msgqueue.c"
                  ,0x69);
          fflush(_stderr);
          nn_err_abort();
        }
        self->cache->next = (nn_msgqueue_chunk *)0x0;
      }
      ((self->out).chunk)->next = self->cache;
      (self->out).chunk = self->cache;
      self->cache = (nn_msgqueue_chunk *)0x0;
      (self->out).pos = 0;
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_msgqueue_send (struct nn_msgqueue *self, struct nn_msg *msg)
{
    size_t msgsz;

    /*  By allowing one message of arbitrary size to be written to the queue,
        we allow even messages that exceed max buffer size to pass through.
        Beyond that we'll apply the buffer limit as specified by the user. */
    msgsz = nn_chunkref_size (&msg->sphdr) + nn_chunkref_size (&msg->body);
    if (nn_slow (self->count > 0 && self->mem + msgsz >= self->maxmem))
        return -EAGAIN;

    /*  Adjust the statistics. */
    ++self->count;
    self->mem += msgsz;

    /*  Move the content of the message to the pipe. */
    nn_msg_mv (&self->out.chunk->msgs [self->out.pos], msg);
    ++self->out.pos;

    /*  If there's no space for a new message in the pipe, either re-use
        the cache chunk or allocate a new chunk if it does not exist. */
    if (nn_slow (self->out.pos == NN_MSGQUEUE_GRANULARITY)) {
        if (nn_slow (!self->cache)) {
            self->cache = nn_alloc (sizeof (struct nn_msgqueue_chunk),
                "msgqueue chunk");
            alloc_assert (self->cache);
            self->cache->next = NULL;
        }
        self->out.chunk->next = self->cache;
        self->out.chunk = self->cache;
        self->cache = NULL;
        self->out.pos = 0;
    }

    return 0;
}